

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

bool __thiscall
basist::bitwise_decoder::read_huffman_table(bitwise_decoder *this,huffman_decoding_table *ct)

{
  char cVar1;
  void *__ptr;
  uint32_t min_new_capacity;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  char *__function;
  uint uVar8;
  undefined1 uVar9;
  uint32_t new_size;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  uint8_vec code_sizes;
  huffman_decoding_table code_length_table;
  uint8_t code_length_code_sizes [21];
  elemental_vector local_88;
  huffman_decoding_table local_78;
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  undefined5 uStack_38;
  
  huffman_decoding_table::clear(ct);
  min_new_capacity = get_bits(this,0xe);
  if (min_new_capacity == 0) {
    bVar16 = true;
  }
  else {
    if (min_new_capacity < 0x4001) {
      local_48 = 0;
      uStack_40 = 0;
      uStack_3b = 0;
      uStack_38 = 0;
      uVar2 = get_bits(this,5);
      if (0xffffffea < uVar2 - 0x16) {
        uVar15 = 0;
        do {
          uVar3 = get_bits(this,3);
          *(char *)((long)&local_48 +
                   (ulong)(byte)(&basisu::g_huffman_sorted_codelength_codes)[uVar15]) = (char)uVar3;
          uVar15 = uVar15 + 1;
        } while (uVar2 != uVar15);
        local_78.m_tree.m_p = (short *)0x0;
        local_78.m_tree.m_size = 0;
        local_78.m_tree.m_capacity = 0;
        local_78.m_lookup.m_p = (int *)0x0;
        local_78.m_lookup.m_size = 0;
        local_78.m_lookup.m_capacity = 0;
        local_78.m_code_sizes.m_p = (uchar *)0x0;
        local_78.m_code_sizes.m_size = 0;
        local_78.m_code_sizes.m_capacity = 0;
        iVar4 = huffman_decoding_table::init(&local_78,(EVP_PKEY_CTX *)0x15);
        if (((char)iVar4 == '\0') || (local_78.m_code_sizes.m_size == 0)) {
          uVar9 = 0;
        }
        else {
          local_88.m_p = (void *)0x0;
          local_88.m_size = 0;
          local_88.m_capacity = 0;
          uVar14 = 0;
          basisu::elemental_vector::increase_capacity
                    (&local_88,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
          __ptr = local_88.m_p;
          memset((void *)((local_88._8_8_ & 0xffffffff) + (long)local_88.m_p),0,
                 (ulong)(min_new_capacity - local_88.m_size));
          local_88.m_size = min_new_capacity;
          do {
            if (local_78.m_code_sizes.m_size == 0) {
              __assert_fail("ct.m_code_sizes.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                            ,0x1bf,
                            "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
                           );
            }
            uVar8 = this->m_bit_buf_size;
            if (uVar8 < 0x10) {
              uVar5 = this->m_bit_buf;
              pbVar12 = this->m_pBuf;
              uVar10 = uVar8;
              do {
                uVar8 = 0;
                pbVar13 = pbVar12;
                if (pbVar12 < this->m_pBuf_end) {
                  pbVar13 = pbVar12 + 1;
                  this->m_pBuf = pbVar13;
                  uVar8 = (uint)*pbVar12;
                }
                uVar5 = uVar5 | uVar8 << ((byte)uVar10 & 0x1f);
                this->m_bit_buf = uVar5;
                uVar8 = uVar10 + 8;
                this->m_bit_buf_size = uVar8;
                bVar16 = uVar10 < 8;
                pbVar12 = pbVar13;
                uVar10 = uVar8;
              } while (bVar16);
            }
            else {
              uVar5 = this->m_bit_buf;
            }
            if (local_78.m_lookup.m_size <= (uVar5 & 0x3ff)) {
              __function = "const T &basisu::vector<int>::operator[](size_t) const [T = int]";
LAB_00151d7d:
              __assert_fail("i < m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                            ,0x177,__function);
            }
            uVar10 = local_78.m_lookup.m_p[uVar5 & 0x3ff];
            if ((int)uVar10 < 0) {
              uVar7 = 10;
              do {
                uVar11 = ~uVar10 + (uint)((uVar5 >> (uVar7 & 0x1f) & 1) != 0);
                if (local_78.m_tree.m_size <= uVar11) {
                  __function = 
                  "const T &basisu::vector<short>::operator[](size_t) const [T = short]";
                  goto LAB_00151d7d;
                }
                uVar7 = uVar7 + 1;
                uVar10 = (uint)local_78.m_tree.m_p[uVar11];
              } while (local_78.m_tree.m_p[uVar11] < 0);
            }
            else {
              uVar7 = uVar10 >> 0x10;
              uVar10 = uVar10 & 0xffff;
            }
            this->m_bit_buf = uVar5 >> ((byte)uVar7 & 0x1f);
            this->m_bit_buf_size = uVar8 - uVar7;
            if ((int)uVar10 < 0x11) {
              if (min_new_capacity <= uVar14) {
LAB_00151d87:
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                              ,0x178,
                              "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]"
                             );
              }
              uVar15 = (ulong)uVar14;
              uVar14 = uVar14 + 1;
              *(char *)((long)__ptr + uVar15) = (char)uVar10;
            }
            else if (uVar10 == 0x12) {
              uVar2 = get_bits(this,7);
              uVar14 = uVar14 + uVar2 + 0xb;
            }
            else if (uVar10 == 0x11) {
              uVar2 = get_bits(this,3);
              uVar14 = uVar14 + uVar2 + 3;
            }
            else {
              if (uVar14 == 0) goto LAB_00151d17;
              if (uVar10 == 0x13) {
                uVar2 = get_bits(this,2);
                iVar4 = uVar2 + 3;
              }
              else {
                uVar2 = get_bits(this,7);
                iVar4 = uVar2 + 7;
              }
              if (min_new_capacity <= uVar14 - 1) goto LAB_00151d87;
              cVar1 = *(char *)((long)__ptr + (ulong)(uVar14 - 1));
              if (cVar1 == '\0') {
                uVar9 = 0;
                goto LAB_00151d1e;
              }
              uVar15 = (ulong)uVar14;
              uVar8 = uVar14;
              if (uVar14 < min_new_capacity) {
                uVar8 = min_new_capacity;
              }
              lVar6 = 0;
              do {
                if (uVar8 - uVar15 == lVar6) goto LAB_00151d17;
                if (min_new_capacity - uVar15 == lVar6) goto LAB_00151d87;
                *(char *)((long)__ptr + lVar6 + uVar15) = cVar1;
                lVar6 = lVar6 + 1;
              } while (iVar4 != (int)lVar6);
              uVar14 = uVar14 + (int)lVar6;
            }
          } while (uVar14 < min_new_capacity);
          if (uVar14 == min_new_capacity) {
            iVar4 = huffman_decoding_table::init(ct,(EVP_PKEY_CTX *)(ulong)min_new_capacity);
            uVar9 = (undefined1)iVar4;
          }
          else {
LAB_00151d17:
            uVar9 = 0;
          }
          if (__ptr != (void *)0x0) {
LAB_00151d1e:
            free(__ptr);
          }
        }
        if (local_78.m_tree.m_p != (short *)0x0) {
          free(local_78.m_tree.m_p);
        }
        if (local_78.m_lookup.m_p != (int *)0x0) {
          free(local_78.m_lookup.m_p);
        }
        if (local_78.m_code_sizes.m_p == (uchar *)0x0) {
          return (bool)uVar9;
        }
        free(local_78.m_code_sizes.m_p);
        return (bool)uVar9;
      }
    }
    bVar16 = false;
  }
  return bVar16;
}

Assistant:

bool read_huffman_table(huffman_decoding_table &ct)
		{
			ct.clear();

			const uint32_t total_used_syms = get_bits(basisu::cHuffmanMaxSymsLog2);

			if (!total_used_syms)
				return true;
			if (total_used_syms > basisu::cHuffmanMaxSyms)
				return false;

			uint8_t code_length_code_sizes[basisu::cHuffmanTotalCodelengthCodes];
			basisu::clear_obj(code_length_code_sizes);

			const uint32_t num_codelength_codes = get_bits(5);
			if ((num_codelength_codes < 1) || (num_codelength_codes > basisu::cHuffmanTotalCodelengthCodes))
				return false;

			for (uint32_t i = 0; i < num_codelength_codes; i++)
				code_length_code_sizes[basisu::g_huffman_sorted_codelength_codes[i]] = static_cast<uint8_t>(get_bits(3));

			huffman_decoding_table code_length_table;
			if (!code_length_table.init(basisu::cHuffmanTotalCodelengthCodes, code_length_code_sizes))
				return false;

			if (!code_length_table.is_valid())
				return false;

			basisu::uint8_vec code_sizes(total_used_syms);

			uint32_t cur = 0;
			while (cur < total_used_syms)
			{
				int c = decode_huffman(code_length_table);

				if (c <= 16)
					code_sizes[cur++] = static_cast<uint8_t>(c);
				else if (c == basisu::cHuffmanSmallZeroRunCode)
					cur += get_bits(basisu::cHuffmanSmallZeroRunExtraBits) + basisu::cHuffmanSmallZeroRunSizeMin;
				else if (c == basisu::cHuffmanBigZeroRunCode)
					cur += get_bits(basisu::cHuffmanBigZeroRunExtraBits) + basisu::cHuffmanBigZeroRunSizeMin;
				else
				{
					if (!cur)
						return false;

					uint32_t l;
					if (c == basisu::cHuffmanSmallRepeatCode)
						l = get_bits(basisu::cHuffmanSmallRepeatExtraBits) + basisu::cHuffmanSmallRepeatSizeMin;
					else
						l = get_bits(basisu::cHuffmanBigRepeatExtraBits) + basisu::cHuffmanBigRepeatSizeMin;

					const uint8_t prev = code_sizes[cur - 1];
					if (prev == 0)
						return false;
					do
					{
						if (cur >= total_used_syms)
							return false;
						code_sizes[cur++] = prev;
					} while (--l > 0);
				}
			}

			if (cur != total_used_syms)
				return false;

			return ct.init(total_used_syms, &code_sizes[0]);
		}